

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::MaxDrawBuffersIndexedTest::iterate
          (MaxDrawBuffersIndexedTest *this)

{
  TestLog *log;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  drawBuffers;
  Random rng;
  BlendState preCommonBlendState;
  ResultCollector results;
  BlendState postCommonBlendState;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&preCommonBlendState,SSBOArrayLengthTests::init::arraysSized + 1,
             (allocator<char> *)&postCommonBlendState);
  tcu::ResultCollector::ResultCollector(&results,log,(string *)&preCommonBlendState);
  std::__cxx11::string::~string((string *)&preCommonBlendState);
  deRandom_init(&rng.m_rnd,this->m_seed);
  preCommonBlendState.enableBlend.m_ptr = (bool *)0x0;
  preCommonBlendState.blendEq.m_ptr =
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0
  ;
  preCommonBlendState.blendFunc.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  preCommonBlendState.colorMask.m_ptr = (Vector<bool,_4> *)0x0;
  postCommonBlendState.enableBlend.m_ptr = (bool *)0x0;
  postCommonBlendState.blendEq.m_ptr =
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0
  ;
  postCommonBlendState.blendFunc.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  postCommonBlendState.colorMask.m_ptr = (Vector<bool,_4> *)0x0;
  drawBuffers.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  drawBuffers.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  drawBuffers.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  genRandomTest(&rng,&preCommonBlendState,&postCommonBlendState,&drawBuffers,4,
                (this->super_TestCase).m_context);
  anon_unknown_0::runTest
            (log,&results,((this->super_TestCase).m_context)->m_renderCtx,&preCommonBlendState,
             &postCommonBlendState,&drawBuffers);
  tcu::ResultCollector::setTestContextResult
            (&results,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ::~vector(&drawBuffers);
  BlendState::~BlendState(&postCommonBlendState);
  BlendState::~BlendState(&preCommonBlendState);
  tcu::ResultCollector::~ResultCollector(&results);
  return STOP;
}

Assistant:

TestCase::IterateResult MaxDrawBuffersIndexedTest::iterate (void)
{
	TestLog&				log						= m_testCtx.getLog();
	tcu::ResultCollector	results					(log);
	de::Random				rng						(m_seed);
	BlendState				preCommonBlendState;
	BlendState				postCommonBlendState;
	vector<DrawBufferInfo>	drawBuffers;

	genRandomTest(rng, preCommonBlendState, postCommonBlendState, drawBuffers, 4, m_context);

	runTest(log, results, m_context.getRenderContext(), preCommonBlendState, postCommonBlendState, drawBuffers);

	results.setTestContextResult(m_testCtx);

	return STOP;
}